

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O1

string * StringBuilder<char,char_const(&)[2]>
                   (string *__return_storage_ptr__,char *arg,char (*args) [2])

{
  size_type *psVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  allocator local_59;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct((ulong)&local_38,'\x01');
  std::__cxx11::string::string((string *)&local_58,*args,&local_59);
  uVar4 = 0xf;
  if (local_38 != local_28) {
    uVar4 = local_28[0];
  }
  if (uVar4 < (ulong)(local_50 + local_30)) {
    uVar4 = 0xf;
    if (local_58 != local_48) {
      uVar4 = local_48[0];
    }
    if ((ulong)(local_50 + local_30) <= uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
      goto LAB_0013c5cd;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
LAB_0013c5cd:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar2 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}